

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O2

int CfdGetDescriptorData
              (void *handle,void *descriptor_handle,uint32_t index,uint32_t *max_index,
              uint32_t *depth,int *script_type,char **locking_script,char **address,int *hash_type,
              char **redeem_script,int *key_type,char **pubkey,char **ext_pubkey,char **ext_privkey,
              bool *is_multisig,uint32_t *max_key_num,uint32_t *req_sig_num)

{
  DescriptorKeyType DVar1;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *this;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint uVar5;
  reference pvVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  CfdException *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar10;
  char *work_pubkey;
  char *local_218;
  char *work_ext_pubkey;
  char *work_redeem_script;
  char *work_address;
  char *work_locking_script;
  char *local_1e8;
  char *local_1e0;
  Pubkey pubkey_obj;
  ExtPrivkey local_1b0;
  ulong local_138;
  SchnorrPubkey schnorr_pubkey_obj;
  ExtPrivkey ext_privkey_obj;
  ExtPubkey ext_pubkey_obj;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&ext_privkey_obj,"Descriptor",(allocator *)&local_1b0);
  cfd::capi::CheckBuffer(descriptor_handle,(string *)&ext_privkey_obj);
  std::__cxx11::string::~string((string *)&ext_privkey_obj);
  this = *(vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> **)
          ((long)descriptor_handle + 0x18);
  if ((this == (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0)
     || ((ulong)(((long)(this->
                        super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->
                       super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x338) <= (ulong)index)) {
    ext_privkey_obj.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_address.cpp";
    ext_privkey_obj.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x27e;
    ext_privkey_obj.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdGetDescriptorData";
    cfd::core::logger::warn<>((CfdSourceLocation *)&ext_privkey_obj,"index is maximum over.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ext_privkey_obj,"Failed to parameter. index is maximum over.",
               (allocator *)&local_1b0);
    cfd::core::CfdException::CfdException(this_00,kCfdOutOfRangeError,(string *)&ext_privkey_obj);
    __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pvVar6 = std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::at
                     (this,(ulong)index);
  uVar5 = (int)(((*(long **)((long)descriptor_handle + 0x18))[1] -
                **(long **)((long)descriptor_handle + 0x18)) / 0x338) - 1;
  local_138 = (ulong)uVar5;
  if (max_index != (uint32_t *)0x0) {
    *max_index = uVar5;
  }
  if (depth != (uint32_t *)0x0) {
    *depth = pvVar6->depth;
  }
  if (script_type != (int *)0x0) {
    *script_type = pvVar6->type;
  }
  if (locking_script == (char **)0x0) {
LAB_0035437b:
    local_1e0 = (char *)0x0;
  }
  else {
    bVar4 = cfd::core::Script::IsEmpty(&pvVar6->locking_script);
    if (bVar4) goto LAB_0035437b;
    cfd::core::Script::GetHex_abi_cxx11_((string *)&ext_privkey_obj,&pvVar6->locking_script);
    local_1e0 = cfd::capi::CreateString((string *)&ext_privkey_obj);
    std::__cxx11::string::~string((string *)&ext_privkey_obj);
  }
  if (address == (char **)0x0) {
LAB_00354423:
    local_218 = (char *)0x0;
  }
  else {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&ext_privkey_obj,&pvVar6->address);
    lVar2 = CONCAT44(ext_privkey_obj.serialize_data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_,
                     ext_privkey_obj.serialize_data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish._0_4_);
    std::__cxx11::string::~string((string *)&ext_privkey_obj);
    if (lVar2 == 0) goto LAB_00354423;
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&ext_privkey_obj,&pvVar6->address);
    if (CONCAT44(ext_privkey_obj.serialize_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 ext_privkey_obj.serialize_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_) == 0) {
      local_218 = (char *)0x0;
    }
    else {
      local_218 = cfd::capi::CreateString((string *)&ext_privkey_obj);
    }
    std::__cxx11::string::~string((string *)&ext_privkey_obj);
  }
  if (hash_type != (int *)0x0) {
    *hash_type = pvVar6->address_type;
  }
  if (redeem_script == (char **)0x0) {
LAB_00354478:
    local_1e8 = (char *)0x0;
  }
  else {
    bVar4 = cfd::core::Script::IsEmpty(&pvVar6->redeem_script);
    if (bVar4) goto LAB_00354478;
    cfd::core::Script::GetHex_abi_cxx11_((string *)&ext_privkey_obj,&pvVar6->redeem_script);
    local_1e8 = cfd::capi::CreateString((string *)&ext_privkey_obj);
    std::__cxx11::string::~string((string *)&ext_privkey_obj);
  }
  if (key_type != (int *)0x0) {
    *key_type = pvVar6->key_type;
  }
  cfd::core::Pubkey::Pubkey(&pubkey_obj);
  cfd::core::ExtPubkey::ExtPubkey(&ext_pubkey_obj);
  cfd::core::ExtPrivkey::ExtPrivkey(&ext_privkey_obj);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&schnorr_pubkey_obj);
  DVar1 = pvVar6->key_type;
  if (DVar1 == kDescriptorKeyBip32) {
    cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)&local_1b0,&pvVar6->key);
    cfd::core::ExtPubkey::operator=(&ext_pubkey_obj,(ExtPubkey *)&local_1b0);
    cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&local_1b0);
    cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_1b0,&ext_pubkey_obj);
LAB_0035460e:
    pvVar10 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj;
LAB_00354613:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(pvVar10,&local_1b0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b0);
  }
  else {
    if (DVar1 == kDescriptorKeyBip32Priv) {
      cfd::core::ExtPrivkey::ExtPrivkey(&local_1b0,&pvVar6->key);
      cfd::core::ExtPrivkey::operator=(&ext_privkey_obj,&local_1b0);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_1b0);
      cfd::core::ExtPrivkey::GetExtPubkey((ExtPubkey *)&local_1b0,&ext_privkey_obj);
      cfd::core::ExtPubkey::operator=(&ext_pubkey_obj,(ExtPubkey *)&local_1b0);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&local_1b0);
      cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_1b0,&ext_pubkey_obj);
      goto LAB_0035460e;
    }
    if (DVar1 == kDescriptorKeySchnorr) {
      cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_1b0,&pvVar6->key);
      pvVar10 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey_obj;
      goto LAB_00354613;
    }
    if ((pvVar6->key)._M_string_length != 0) {
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_1b0,&pvVar6->key);
      goto LAB_0035460e;
    }
  }
  if (pubkey == (char **)0x0) {
LAB_0035469c:
    pcVar7 = (char *)0x0;
  }
  else {
    bVar4 = cfd::core::Pubkey::IsValid(&pubkey_obj);
    if (bVar4) {
      cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&local_1b0,&pubkey_obj);
      pcVar7 = cfd::capi::CreateString((string *)&local_1b0);
    }
    else {
      bVar4 = cfd::core::SchnorrPubkey::IsValid(&schnorr_pubkey_obj);
      if (!bVar4) goto LAB_0035469c;
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&local_1b0,&schnorr_pubkey_obj);
      pcVar7 = cfd::capi::CreateString((string *)&local_1b0);
    }
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  if (ext_pubkey == (char **)0x0) {
LAB_003546ed:
    pcVar8 = (char *)0x0;
  }
  else {
    bVar4 = cfd::core::ExtPubkey::IsValid(&ext_pubkey_obj);
    if (!bVar4) goto LAB_003546ed;
    cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)&local_1b0,&ext_pubkey_obj);
    pcVar8 = cfd::capi::CreateString((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  if (ext_privkey != (char **)0x0) {
    bVar4 = cfd::core::ExtPrivkey::IsValid(&ext_privkey_obj);
    if (bVar4) {
      cfd::core::ExtPrivkey::ToString_abi_cxx11_((string *)&local_1b0,&ext_privkey_obj);
      pcVar9 = cfd::capi::CreateString((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      goto LAB_0035473a;
    }
  }
  pcVar9 = (char *)0x0;
LAB_0035473a:
  if (is_multisig != (bool *)0x0) {
    lVar2 = **(long **)((long)descriptor_handle + 0x20);
    lVar3 = (*(long **)((long)descriptor_handle + 0x20))[1];
    if ((uint32_t)local_138 == index && lVar2 != lVar3) {
      *is_multisig = true;
      if (max_key_num != (uint32_t *)0x0) {
        *max_key_num = (uint32_t)((lVar3 - lVar2) / 0x28);
      }
      if (req_sig_num != (uint32_t *)0x0) {
        *req_sig_num = pvVar6->multisig_req_sig_num;
      }
    }
    else {
      *is_multisig = false;
    }
  }
  if (local_1e0 != (char *)0x0) {
    *locking_script = local_1e0;
  }
  if (local_218 != (char *)0x0) {
    *address = local_218;
  }
  if (local_1e8 != (char *)0x0) {
    *redeem_script = local_1e8;
  }
  if (pcVar7 != (char *)0x0) {
    *pubkey = pcVar7;
  }
  if (pcVar8 != (char *)0x0) {
    *ext_pubkey = pcVar8;
  }
  if (pcVar9 != (char *)0x0) {
    *ext_privkey = pcVar9;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey_obj);
  cfd::core::ExtPrivkey::~ExtPrivkey(&ext_privkey_obj);
  cfd::core::ExtPubkey::~ExtPubkey(&ext_pubkey_obj);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj);
  return 0;
}

Assistant:

int CfdGetDescriptorData(
    void* handle, void* descriptor_handle, uint32_t index, uint32_t* max_index,
    uint32_t* depth, int* script_type, char** locking_script, char** address,
    int* hash_type, char** redeem_script, int* key_type, char** pubkey,
    char** ext_pubkey, char** ext_privkey, bool* is_multisig,
    uint32_t* max_key_num, uint32_t* req_sig_num) {
  char* work_locking_script = nullptr;
  char* work_address = nullptr;
  char* work_redeem_script = nullptr;
  char* work_pubkey = nullptr;
  char* work_ext_pubkey = nullptr;
  char* work_ext_privkey = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(descriptor_handle, kPrefixOutputDescriptor);

    CfdCapiOutputDescriptor* buffer =
        static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
    if ((buffer->script_list == nullptr) ||
        (index >= buffer->script_list->size())) {
      warn(CFD_LOG_SOURCE, "index is maximum over.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. index is maximum over.");
    }

    const DescriptorScriptData& desc_data = buffer->script_list->at(index);
    uint32_t last_index =
        static_cast<uint32_t>(buffer->script_list->size()) - 1;
    if (max_index != nullptr) *max_index = last_index;
    if (depth != nullptr) *depth = desc_data.depth;
    if (script_type != nullptr) *script_type = desc_data.type;
    if ((locking_script != nullptr) && (!desc_data.locking_script.IsEmpty())) {
      work_locking_script = CreateString(desc_data.locking_script.GetHex());
    }
    if ((address != nullptr) && (!desc_data.address.GetAddress().empty())) {
      std::string addr = desc_data.address.GetAddress();
      if (!addr.empty()) work_address = CreateString(addr);
    }
    if (hash_type != nullptr) {
      *hash_type = desc_data.address_type;
    }
    if ((redeem_script != nullptr) && (!desc_data.redeem_script.IsEmpty())) {
      work_redeem_script = CreateString(desc_data.redeem_script.GetHex());
    }
    if (key_type != nullptr) {
      *key_type = desc_data.key_type;
    }

    Pubkey pubkey_obj;
    ExtPubkey ext_pubkey_obj;
    ExtPrivkey ext_privkey_obj;
    SchnorrPubkey schnorr_pubkey_obj;
    switch (desc_data.key_type) {
      case DescriptorKeyType::kDescriptorKeyBip32Priv:
        ext_privkey_obj = ExtPrivkey(desc_data.key);
        ext_pubkey_obj = ext_privkey_obj.GetExtPubkey();
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyBip32:
        ext_pubkey_obj = ExtPubkey(desc_data.key);
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeySchnorr:
        schnorr_pubkey_obj = SchnorrPubkey(desc_data.key);
        break;
      case DescriptorKeyType::kDescriptorKeyPublic:
      default:
        if (!desc_data.key.empty()) pubkey_obj = Pubkey(desc_data.key);
        break;
    }
    if ((pubkey != nullptr) && (pubkey_obj.IsValid())) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    } else if ((pubkey != nullptr) && (schnorr_pubkey_obj.IsValid())) {
      work_pubkey = CreateString(schnorr_pubkey_obj.GetHex());
    }
    if ((ext_pubkey != nullptr) && (ext_pubkey_obj.IsValid())) {
      work_ext_pubkey = CreateString(ext_pubkey_obj.ToString());
    }
    if ((ext_privkey != nullptr) && (ext_privkey_obj.IsValid())) {
      work_ext_privkey = CreateString(ext_privkey_obj.ToString());
    }
    if (is_multisig != nullptr) {
      if ((!buffer->multisig_key_list->empty()) && (index == last_index)) {
        *is_multisig = true;
        if (max_key_num != nullptr) {
          *max_key_num =
              static_cast<uint32_t>(buffer->multisig_key_list->size());
        }
        if (req_sig_num != nullptr) {
          *req_sig_num = static_cast<uint32_t>(desc_data.multisig_req_sig_num);
        }
      } else {
        *is_multisig = false;
      }
    }

    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_address != nullptr) *address = work_address;
    if (work_redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    if (work_ext_pubkey != nullptr) *ext_pubkey = work_ext_pubkey;
    if (work_ext_privkey != nullptr) *ext_privkey = work_ext_privkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
        &work_ext_pubkey, &work_ext_privkey);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}